

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall ThreadContext::~ThreadContext(ThreadContext *this)

{
  IdleDecommitPageAllocator *this_00;
  RecyclerRootPtr<ThreadContext::RecyclableData> *this_01;
  DListBase<Js::EntryPointInfo_*,_RealCount> *this_02;
  ThreadContextTTD *this_03;
  ExecutionInfoManager *this_04;
  EventLog *this_05;
  InterruptPoller *buffer;
  BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
  *this_06;
  BVSparse<Memory::HeapAllocator> *this_07;
  Recycler *this_08;
  BackgroundJobProcessor *this_09;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RecyclableData *pRVar5;
  size_t byteSize;
  char16_t *pcVar6;
  ScriptContext *pSVar7;
  AutoLeakReportSection local_68;
  AutoLeakReportSection __autoLeakReportSection0;
  
  CCLock::Enter(&s_csThreadContext.super_CCLock);
  JsUtil::DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>::
  UnlinkPartial<ThreadContext>(this,&globalListFirst,&globalListLast);
  (this->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>).previous = (Type)0x0;
  (this->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>).next = (Type)0x0;
  CCLock::Leave(&s_csThreadContext.super_CCLock);
  this_03 = this->TTDContext;
  if (this_03 != (ThreadContextTTD *)0x0) {
    TTD::ThreadContextTTD::~ThreadContextTTD(this_03);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_03,0x160);
    this->TTDContext = (ThreadContextTTD *)0x0;
  }
  this_04 = this->TTDExecutionInfo;
  if (this_04 != (ExecutionInfoManager *)0x0) {
    TTD::ExecutionInfoManager::~ExecutionInfoManager(this_04);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_04,0x248);
    this->TTDExecutionInfo = (ExecutionInfoManager *)0x0;
  }
  this_05 = this->TTDLog;
  if (this_05 != (EventLog *)0x0) {
    TTD::EventLog::~EventLog(this_05);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_05,0x2e8);
    this->TTDLog = (EventLog *)0x0;
  }
  bVar3 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,LeakReportFlag);
  if (bVar3) {
    if (this->recycler->inDllCanUnloadNow == false) {
      pcVar6 = L"Destructor";
      if (this->recycler->inDetachProcess != false) {
        pcVar6 = L"DetachProcess";
      }
    }
    else {
      pcVar6 = L"DllCanUnloadNow";
    }
    Memory::AutoLeakReportSection::AutoLeakReportSection
              (&local_68,(ConfigFlagsTable *)&Js::Configuration::Global,
               L"Thread Context (%p): %s (TID: %d)",this,pcVar6,(ulong)this->threadId);
    Memory::LeakReport::DumpUrl(this->threadId);
    Memory::AutoLeakReportSection::~AutoLeakReportSection(&local_68);
  }
  buffer = this->interruptPoller;
  if (buffer != (InterruptPoller *)0x0) {
    (**buffer->_vptr_InterruptPoller)(buffer);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,0x20);
    this->interruptPoller = (InterruptPoller *)0x0;
  }
  this_00 = &this->pageAllocator;
  Memory::IdleDecommitPageAllocator::ShutdownIdleDecommit(this_00);
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::Close(&this_00->super_PageAllocator);
  if (this->recycler != (Recycler *)0x0) {
    pSVar7 = this->scriptContextList;
    if (pSVar7 != (ScriptContext *)0x0) {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if (pSVar7->isScriptContextActuallyClosed == false) {
          if (this->callRootLevel != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                               ,0x1bf,"(!IsInScript())","Can we be in script here?");
            if (!bVar3) goto LAB_007b8c5e;
            *puVar4 = 0;
          }
          Js::ScriptContext::MarkForClose(pSVar7);
        }
        pSVar7 = pSVar7->next;
      } while (pSVar7 != (ScriptContext *)0x0);
    }
    this_01 = &this->recyclableData;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
    if ((pRVar5->sourceProfileManagersByUrl).ptr !=
        (BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
      pBVar1 = (pRVar5->sourceProfileManagersByUrl).ptr;
      if (pBVar1->count != pBVar1->freeCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                           ,0x1c7,
                           "(this->recyclableData->sourceProfileManagersByUrl == nullptr || this->recyclableData->sourceProfileManagersByUrl->Count() == 0)"
                           ,"There seems to have been a refcounting imbalance.");
        if (!bVar3) goto LAB_007b8c5e;
        *puVar4 = 0;
      }
    }
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
    (pRVar5->sourceProfileManagersByUrl).ptr =
         (BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          *)0x0;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
    (pRVar5->oldEntryPointInfo).ptr = (FunctionEntryPointInfo *)0x0;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
    if ((pRVar5->symbolRegistrationMap).ptr !=
        (BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
      JsUtil::
      BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Clear((pRVar5->symbolRegistrationMap).ptr);
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
      (pRVar5->symbolRegistrationMap).ptr =
           (BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)0x0;
    }
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
    if ((pRVar5->returnedValueList).ptr !=
        (List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
        )0x0) {
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
      (((pRVar5->returnedValueList).ptr)->
      super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).count = 0;
      pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(this_01);
      (pRVar5->returnedValueList).ptr =
           (List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
    }
    this_06 = &this->propertyMap->
               super_BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
    ;
    if (this_06 !=
        (BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
         *)0x0) {
      JsUtil::
      BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
      ::~BaseDictionary(this_06);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_06,0x78);
      this->propertyMap = (PropertyMap *)0x0;
    }
    this_07 = this->m_jitNumericProperties;
    if (this_07 != (BVSparse<Memory::HeapAllocator> *)0x0) {
      BVSparse<Memory::HeapAllocator>::~BVSparse(this_07);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_07,0x20);
      this->m_jitNumericProperties = (BVSparse<Memory::HeapAllocator> *)0x0;
    }
    Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::Unroot(this_01,this->recycler);
    for (pSVar7 = this->scriptContextList; pSVar7 != (ScriptContext *)0x0; pSVar7 = pSVar7->next) {
      pSVar7->referencesSharedDynamicSourceContextInfo = false;
      Js::ScriptContext::ShutdownClearSourceLists(pSVar7);
    }
    if (this->rootTrackerScriptContext != (ScriptContext *)0x0) {
      Js::ScriptContext::Close(this->rootTrackerScriptContext,false);
    }
    if (this->debugManager != (DebugManager *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0x209,"(this->debugManager == nullptr)","this->debugManager == nullptr");
      if (!bVar3) goto LAB_007b8c5e;
      *puVar4 = 0;
    }
    this_08 = this->recycler;
    Memory::Recycler::~Recycler(this_08);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_08,0x166e0);
  }
  this_09 = (BackgroundJobProcessor *)this->jobProcessor;
  if (this_09 != (BackgroundJobProcessor *)0x0) {
    byteSize = 0x38;
    if (this->bgJit == true) {
      JsUtil::BackgroundJobProcessor::~BackgroundJobProcessor(this_09);
      byteSize = 0xb0;
    }
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_09,byteSize);
    this->jobProcessor = (JobProcessor *)0x0;
  }
  __autoLeakReportSection0.m_flags = (ConfigFlagsTable *)&this->collectCallBackList;
  DListBase<ThreadContext::CollectCallBack,_RealCount>::Clear<Memory::HeapAllocator>
            ((DListBase<ThreadContext::CollectCallBack,_RealCount> *)
             __autoLeakReportSection0.m_flags,&Memory::HeapAllocator::Instance);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->protoInlineCacheByPropId);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->storeFieldInlineCacheByPropId);
  JsUtil::
  BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->isInstInlineCacheByFunction);
  this_02 = &this->equivalentTypeCacheEntryPoints;
  (this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>.next.list =
       this_02;
  (this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>.prev.list =
       this_02;
  (this->equivalentTypeCacheEntryPoints).super_RealCount.count = 0;
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Reset
            (&this->noSpecialPropertyRegistry);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Reset
            (&this->onlyWritablePropertyRegistry);
  this->registeredInlineCacheCount = 0;
  this->unregisteredInlineCacheCount = 0;
  if (this->heapEnum != (IActiveScriptProfilerHeapEnum *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x231,"(this->GetHeapEnum() == nullptr)",
                       "Heap enumeration should have been cleared/closed by the ScriptSite.");
    if (!bVar3) goto LAB_007b8c5e;
    *puVar4 = 0;
  }
  if (this->heapEnum != (IActiveScriptProfilerHeapEnum *)0x0) {
    ClearHeapEnum(this);
  }
  bVar3 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutByteCodeFlag);
  if ((bVar3) && (_DAT_015aa378 == _DAT_015aa380)) {
    Output::Print(L"Bail out byte code location count: %d",(ulong)this->bailOutByteCodeLocationCount
                 );
  }
  if (processNativeCodeSize < this->nativeCodeSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x23f,"(processNativeCodeSize >= nativeCodeSize)",
                       "processNativeCodeSize >= nativeCodeSize");
    if (!bVar3) {
LAB_007b8c5e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  LOCK();
  processNativeCodeSize = processNativeCodeSize - this->nativeCodeSize;
  UNLOCK();
  if (this->dynamicProfileMutator != (DynamicProfileMutator *)0x0) {
    (**(code **)(*(long *)this->dynamicProfileMutator + 8))();
  }
  JsUtil::
  BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->entryPointToBuiltInOperationIdCache);
  DelayLoadLibrary::~DelayLoadLibrary(&(this->ucrtC99MathApis).super_DelayLoadLibrary);
  JsUtil::
  BaseDictionary<const_Js::DynamicType_*,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->dynamicObjectEnumeratorCacheMap);
  CCLock::~CCLock(&(this->csFunctionBody).super_CCLock);
  CCLock::~CCLock(&(this->csCollectionCallBack).super_CCLock);
  DListBase<ThreadContext::CollectCallBack,_RealCount>::~DListBase
            ((DListBase<ThreadContext::CollectCallBack,_RealCount> *)
             __autoLeakReportSection0.m_flags);
  DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
  ::~DListBase(&(this->onlyWritablePropertyRegistry).scriptRegistrations);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             &this->onlyWritablePropertyRegistry);
  DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
  ::~DListBase(&(this->noSpecialPropertyRegistry).scriptRegistrations);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             &this->noSpecialPropertyRegistry);
  JsUtil::
  BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->isInstInlineCacheByFunction);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->storeFieldInlineCacheByPropId);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->protoInlineCacheByPropId);
  DListBase<Js::EntryPointInfo_*,_RealCount>::~DListBase(this_02);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->equivalentTypeCacheInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->isInstInlineCacheThreadInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->inlineCacheThreadInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::~RecyclerRootPtr(&this->recyclableData);
  Memory::
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  ::~PageAllocatorBase
            (&(this->codePageAllocators).preReservedHeapAllocator.
              super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            );
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase
            (&(this->codePageAllocators).pageAllocator.
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            );
  CCLock::~CCLock((CCLock *)&this->codePageAllocators);
  Memory::
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  ::~PageAllocatorBase
            (&(this->thunkPageAllocators).preReservedHeapAllocator.
              super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            );
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase
            (&(this->thunkPageAllocators).pageAllocator.
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            );
  CCLock::~CCLock((CCLock *)&this->thunkPageAllocators);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->threadAlloc).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Js::DelayedFreeArrayBuffer::~DelayedFreeArrayBuffer(&this->delayFreeCallback);
  (this->pageAllocator).super_PageAllocator._vptr_PageAllocatorBase =
       (_func_int **)&PTR_SetDisableThreadAccessCheck_014ee748;
  CCLock::~CCLock(&(this->pageAllocator).cs.super_CCLock);
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase(&this_00->super_PageAllocator);
  CCLock::~CCLock(&(this->backgroundPageQueue).backgroundPageQueueCriticalSection.super_CCLock);
  Memory::PreReservedVirtualAllocWrapper::~PreReservedVirtualAllocWrapper
            (&this->preReservedVirtualAllocator);
  return;
}

Assistant:

ThreadContext::~ThreadContext()
{
    {
        AutoCriticalSection autocs(ThreadContext::GetCriticalSection());
        ThreadContext::Unlink(this, &ThreadContext::globalListFirst, &ThreadContext::globalListLast);
    }

#if ENABLE_TTD
    if(this->TTDContext != nullptr)
    {
        TT_HEAP_DELETE(TTD::ThreadContextTTD, this->TTDContext);
        this->TTDContext = nullptr;
    }

    if(this->TTDExecutionInfo != nullptr)
    {
        TT_HEAP_DELETE(TTD::ThreadContextTTD, this->TTDExecutionInfo);
        this->TTDExecutionInfo = nullptr;
    }

    if(this->TTDLog != nullptr)
    {
        TT_HEAP_DELETE(TTD::EventLog, this->TTDLog);
        this->TTDLog = nullptr;
    }
#endif

#ifdef LEAK_REPORT
    if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
    {
        AUTO_LEAK_REPORT_SECTION(Js::Configuration::Global.flags, _u("Thread Context (%p): %s (TID: %d)"), this,
            this->GetRecycler()->IsInDllCanUnloadNow()? _u("DllCanUnloadNow") :
            this->GetRecycler()->IsInDetachProcess()? _u("DetachProcess") : _u("Destructor"), this->threadId);
        LeakReport::DumpUrl(this->threadId);
    }
#endif
    if (interruptPoller)
    {
        HeapDelete(interruptPoller);
        interruptPoller = nullptr;
    }

#if DBG
    // ThreadContext dtor may be running on a different thread.
    // Recycler may call finalizer that free temp Arenas, which will free pages back to
    // the page Allocator, which will try to suspend idle on a different thread.
    // So we need to disable idle decommit asserts.
    pageAllocator.ShutdownIdleDecommit();
#endif

    // Allocating memory during the shutdown codepath is not preferred
    // so we'll close the page allocator before we release the GC
    // If any dispose is allocating memory during shutdown, that is a bug
    pageAllocator.Close();

    // The recycler need to delete before the background code gen thread
    // because that might run finalizer which need access to the background code gen thread.
    if (recycler != nullptr)
    {
        for (Js::ScriptContext *scriptContext = scriptContextList; scriptContext; scriptContext = scriptContext->next)
        {
            if (!scriptContext->IsActuallyClosed())
            {
                // We close ScriptContext here because anyhow HeapDelete(recycler) when disposing the
                // JavaScriptLibrary will close ScriptContext. Explicit close gives us chance to clear
                // other things to which ScriptContext holds reference to
                AssertMsg(!IsInScript(), "Can we be in script here?");
                scriptContext->MarkForClose();
            }
        }

        // If all scriptContext's have been closed, then the sourceProfileManagersByUrl
        // should have been released
        AssertMsg(this->recyclableData->sourceProfileManagersByUrl == nullptr ||
            this->recyclableData->sourceProfileManagersByUrl->Count() == 0, "There seems to have been a refcounting imbalance.");

        this->recyclableData->sourceProfileManagersByUrl = nullptr;
        this->recyclableData->oldEntryPointInfo = nullptr;

        if (this->recyclableData->symbolRegistrationMap != nullptr)
        {
            this->recyclableData->symbolRegistrationMap->Clear();
            this->recyclableData->symbolRegistrationMap = nullptr;
        }

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->recyclableData->returnedValueList != nullptr)
        {
            this->recyclableData->returnedValueList->Clear();
            this->recyclableData->returnedValueList = nullptr;
        }
#endif

        if (this->propertyMap != nullptr)
        {
            HeapDelete(this->propertyMap);
            this->propertyMap = nullptr;
        }

#if ENABLE_NATIVE_CODEGEN
        if (this->m_jitNumericProperties != nullptr)
        {
            HeapDelete(this->m_jitNumericProperties);
            this->m_jitNumericProperties = nullptr;
        }
#endif
        // Unpin the memory for leak report so we don't report this as a leak.
        recyclableData.Unroot(recycler);

#if defined(LEAK_REPORT) || defined(CHECK_MEMORY_LEAK)
        for (Js::ScriptContext *scriptContext = scriptContextList; scriptContext; scriptContext = scriptContext->next)
        {
            scriptContext->ClearSourceContextInfoMaps();
            scriptContext->ShutdownClearSourceLists();
        }

#ifdef LEAK_REPORT
        // heuristically figure out which one is the root tracker script engine
        // and force close on it
        if (this->rootTrackerScriptContext != nullptr)
        {
            this->rootTrackerScriptContext->Close(false);
        }
#endif
#endif
#if ENABLE_NATIVE_CODEGEN
#if !FLOATVAR
        if (this->codeGenNumberThreadAllocator)
        {
            HeapDelete(this->codeGenNumberThreadAllocator);
            this->codeGenNumberThreadAllocator = nullptr;
        }
        if (this->xProcNumberPageSegmentManager)
        {
            HeapDelete(this->xProcNumberPageSegmentManager);
            this->xProcNumberPageSegmentManager = nullptr;
        }
#endif
#endif
#ifdef ENABLE_SCRIPT_DEBUGGING
        Assert(this->debugManager == nullptr);
#endif

#if ENABLE_CONCURRENT_GC && defined(_WIN32)
        AssertOrFailFastMsg(recycler->concurrentThread == NULL, "Recycler background thread should have been shutdown before destroying Recycler.");
        AssertOrFailFastMsg((recycler->parallelThread1.concurrentThread == NULL) && (recycler->parallelThread2.concurrentThread == NULL), "Recycler parallelThread(s) should have been shutdown before destroying Recycler.");
#endif

        HeapDelete(recycler);
    }

#if ENABLE_NATIVE_CODEGEN
    if(jobProcessor)
    {
        if(this->bgJit)
        {
            HeapDelete(static_cast<JsUtil::BackgroundJobProcessor *>(jobProcessor));
        }
        else
        {
            HeapDelete(static_cast<JsUtil::ForegroundJobProcessor *>(jobProcessor));
        }
        jobProcessor = nullptr;
    }
#endif

    // Do not require all GC callbacks to be revoked, because Trident may not revoke if there
    // is a leak, and we don't want the leak to be masked by an assert

    this->collectCallBackList.Clear(&HeapAllocator::Instance);
    this->protoInlineCacheByPropId.Reset();
    this->storeFieldInlineCacheByPropId.Reset();
    this->isInstInlineCacheByFunction.Reset();
    this->equivalentTypeCacheEntryPoints.Reset();
    this->noSpecialPropertyRegistry.Reset();
    this->onlyWritablePropertyRegistry.Reset();

    this->registeredInlineCacheCount = 0;
    this->unregisteredInlineCacheCount = 0;

    AssertMsg(this->GetHeapEnum() == nullptr, "Heap enumeration should have been cleared/closed by the ScriptSite.");
    if (this->GetHeapEnum() != nullptr)
    {
        this->ClearHeapEnum();
    }

#ifdef BAILOUT_INJECTION
    if (Js::Configuration::Global.flags.IsEnabled(Js::BailOutByteCodeFlag)
        && Js::Configuration::Global.flags.BailOutByteCode.Empty())
    {
        Output::Print(_u("Bail out byte code location count: %d"), this->bailOutByteCodeLocationCount);
    }
#endif

    Assert(processNativeCodeSize >= nativeCodeSize);
    ::InterlockedExchangeSubtract(&processNativeCodeSize, nativeCodeSize);

    PERF_COUNTER_DEC(Basic, ThreadContext);

#ifdef DYNAMIC_PROFILE_MUTATOR
    if (this->dynamicProfileMutator != nullptr)
    {
        this->dynamicProfileMutator->Delete();
    }
#endif
}